

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_inverted_9(void)

{
  run("nested truthy sections should be omitted","| A {{^bool}}B {{^bool}}C{{/bool}} D{{/bool}} E |"
      ,"{\"bool\": true}",(char *)0x0,"| A  E |");
  return;
}

Assistant:

static void
test_inverted_9(void)
{
    run(
        "nested truthy sections should be omitted",
        "| A {{^bool}}B {{^bool}}C{{/bool}} D{{/bool}} E |",
        "{\"bool\": true}",
        NULL,
        "| A  E |"
    );
}